

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTchr.cpp
# Opt level: O0

void __thiscall NaPNTeacher::post_action(NaPNTeacher *this)

{
  int iVar1;
  NaPetriCnInput *in_RDI;
  
  iVar1 = NaPetriConnector::links((NaPetriConnector *)0x15508f);
  if (iVar1 == 0) {
    NaPetriCnInput::commit_data(in_RDI);
    NaPetriCnInput::commit_data(in_RDI);
  }
  else {
    NaPetriCnInput::commit_data(in_RDI);
  }
  NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x1550d7);
  return;
}

Assistant:

void
NaPNTeacher::post_action ()
{
    if(errout.links() == 0){
        // Input pack #1
        desout.commit_data();
        nnout.commit_data();
    }else{
        // Input pack #2
        errout.commit_data();
    }
    errinp.commit_data();
}